

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O0

void __thiscall indigox::Atom::RemoveBond(Atom *this,Bond_p *b)

{
  bool bVar1;
  weak_ptr<indigox::Bond> *in_RSI;
  vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_> *in_RDI;
  AtomBondIterator it;
  vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  byte in_stack_ffffffffffffffa7;
  const_iterator in_stack_ffffffffffffffb8;
  __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (weak_ptr<indigox::Bond> *)
       std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::
       begin(in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::end
              (in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       (__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
    ::operator->(local_18);
    std::weak_ptr<indigox::Bond>::lock(in_RSI);
    in_stack_ffffffffffffffa7 =
         std::operator==((shared_ptr<indigox::Bond> *)
                         CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         (shared_ptr<indigox::Bond> *)in_stack_ffffffffffffff98);
    std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x10b857);
    if ((in_stack_ffffffffffffffa7 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
    ::operator++(local_18);
  }
  std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::end
            (in_stack_ffffffffffffff98);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     (__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                      *)in_stack_ffffffffffffff98);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<indigox::Bond>const*,std::vector<std::weak_ptr<indigox::Bond>,std::allocator<std::weak_ptr<indigox::Bond>>>>
    ::__normal_iterator<std::weak_ptr<indigox::Bond>*>
              ((__normal_iterator<const_std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                *)(in_RDI + 5));
    std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::erase
              (in_RDI,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void Atom::RemoveBond(Bond_p b) {
    AtomBondIterator it = bonds_.begin();
    for (; it != bonds_.end(); ++it) {
      if (it->lock() == b) break;
    }
    if (it != bonds_.end()) bonds_.erase(it);
  }